

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::SSBOBarrierCase::iterate(SSBOBarrierCase *this)

{
  size_type *__x;
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  RenderContext *pRVar4;
  glUniform1uiFunc p_Var5;
  int iVar6;
  ContextType type;
  GLSLVersion version;
  int iVar7;
  GLuint GVar8;
  GLenum GVar9;
  deUint32 dVar10;
  GLint GVar11;
  char *__s;
  size_t sVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar13;
  undefined4 extraout_var_01;
  TestLog *log;
  TestError *pTVar14;
  long lVar15;
  int iVar16;
  Buffer tempBuffer;
  InterfaceVariableInfo valueInfo_1;
  BufferMemMap bufMap_1;
  Buffer outputBuffer;
  InterfaceVariableInfo valueInfo;
  ShaderProgram program1;
  ShaderProgram program0;
  ostringstream src1;
  ostringstream src0;
  undefined1 auStack_6e8 [8];
  undefined1 local_6e0 [32];
  InterfaceVariableInfo local_6c0;
  BufferMemMap local_670;
  ObjectWrapper local_658;
  undefined1 local_640 [8];
  pointer local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_630;
  pointer local_620;
  deUint32 local_618;
  undefined8 local_614;
  deUint32 dStack_60c;
  int iStack_608;
  undefined5 uStack_604;
  undefined8 uStack_5ff;
  ios_base local_5c8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_5b0;
  undefined1 local_590 [208];
  undefined1 local_4c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8 [8];
  GLuint local_428;
  bool local_400;
  ShaderProgram local_3f0;
  long local_320 [14];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  __s = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_6e8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x540);
  }
  else {
    sVar12 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout (local_size_x = 1) in;\nuniform uint u_baseVal;\nlayout(binding = 1) buffer Output {\n    uint values[];\n};\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    values[offset] = u_baseVal+offset;\n}\n"
             ,0x12f);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_6e8 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x3c8);
  }
  else {
    sVar12 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "layout (local_size_x = 1) in;\nuniform uint u_baseVal;\nlayout(binding = 1) buffer Input {\n    uint values[];\n};\nlayout(binding = 0) buffer Output {\n    coherent uint sum;\n};\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    uint value  = values[offset];\n    atomicAdd(sum, value);\n}\n"
             ,0x182);
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_590[0x10] = 0;
  local_590._17_8_ = 0;
  local_590._0_8_ = (pointer)0x0;
  local_590[8] = 0;
  local_590._9_7_ = 0;
  memset(local_640,0,0xac);
  std::__cxx11::stringbuf::str();
  local_4c0._0_4_ = 5;
  local_4c0._8_8_ = local_4a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4c0 + 8),local_6c0.name._M_dataplus._M_p,
             local_6c0.name._M_dataplus._M_p + local_6c0.name._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_640 + (ulong)(uint)local_4c0._0_4_ * 0x18),(value_type *)(local_4c0 + 8));
  glu::ShaderProgram::ShaderProgram(&local_3f0,pRVar4,(ProgramSources *)local_640);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._8_8_ != local_4a8) {
    operator_delete((void *)local_4c0._8_8_,local_4a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.name._M_dataplus._M_p != &local_6c0.name.field_2) {
    operator_delete(local_6c0.name._M_dataplus._M_p,
                    CONCAT71(local_6c0.name.field_2._M_allocated_capacity._1_7_,
                             local_6c0.name.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_590);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_5b0);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_640 + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_590[0x10] = 0;
  local_590._17_8_ = 0;
  local_590._0_8_ = (pointer)0x0;
  local_590[8] = 0;
  local_590._9_7_ = 0;
  memset(local_640,0,0xac);
  std::__cxx11::stringbuf::str();
  __x = &local_6c0.name._M_string_length;
  local_6c0.name._M_dataplus._M_p._0_4_ = 5;
  puVar1 = (undefined1 *)((long)&local_6c0.name.field_2 + 8);
  local_6c0.name._M_string_length = (size_type)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__x,local_6e0._0_8_,
             (undefined1 *)
             ((long)(glActiveShaderProgramFunc *)local_6e0._0_8_ + (long)(char **)local_6e0._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_640 + ((ulong)local_6c0.name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)__x);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_4c0,pRVar4,(ProgramSources *)local_640);
  if ((undefined1 *)local_6c0.name._M_string_length != puVar1) {
    operator_delete((void *)local_6c0.name._M_string_length,local_6c0.name.field_2._8_8_ + 1);
  }
  if ((Functions *)local_6e0._0_8_ != (Functions *)(local_6e0 + 0x10)) {
    operator_delete((void *)local_6e0._0_8_,CONCAT44(local_6e0._20_4_,local_6e0._16_4_) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_590);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_5b0);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_640 + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar7);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_6e0,(Functions *)CONCAT44(extraout_var_00,iVar7),pOVar13);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_658,(Functions *)CONCAT44(extraout_var_01,iVar7),pOVar13)
  ;
  log = glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        &local_3f0);
  glu::operator<<(log,(ShaderProgram *)local_4c0);
  if ((local_3f0.m_program.m_info.linkOk == true) && (local_400 != false)) {
    local_640 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_638);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_638,"Work groups: ",0xd);
    tcu::operator<<((ostream *)&local_638,&this->m_workSize);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_640,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_638);
    std::ios_base::~ios_base(local_5c8);
    GVar8 = (*gl->getProgramResourceIndex)(local_3f0.m_program.m_program,0x92e5,"values[0]");
    local_640 = (undefined1  [8])&local_630;
    local_638 = (pointer)0x0;
    local_630._M_local_buf[0] = '\0';
    local_620 = (pointer)0xffffffffffffffff;
    local_618 = 0xffffffff;
    local_614 = 0;
    dStack_60c = 0;
    iStack_608 = 0;
    uStack_604 = 0;
    uStack_5ff = 0;
    glu::getProgramInterfaceVariableInfo
              (gl,local_3f0.m_program.m_program,0x92e5,GVar8,(InterfaceVariableInfo *)local_640);
    iVar6 = iStack_608;
    iVar7 = (this->m_workSize).m_data[0];
    iVar16 = (this->m_workSize).m_data[1];
    iVar3 = (this->m_workSize).m_data[2];
    (*gl->bindBuffer)(0x90d2,local_6e0._16_4_);
    (*gl->bufferData)(0x90d2,(ulong)(uint)(iVar16 * iVar3 * iVar7 * iVar6),(void *)0x0,0x88e4);
    (*gl->bindBufferBase)(0x90d2,1,local_6e0._16_4_);
    GVar9 = (*gl->getError)();
    glu::checkError(GVar9,"Temp buffer setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x2f8);
    if (local_640 != (undefined1  [8])&local_630) {
      operator_delete((void *)local_640,
                      CONCAT71(local_630._M_allocated_capacity._1_7_,local_630._M_local_buf[0]) + 1)
      ;
    }
    GVar8 = (*gl->getProgramResourceIndex)(local_428,0x92e6,"Output");
    paVar2 = &local_6c0.name.field_2;
    dVar10 = glu::getProgramResourceUint(gl,local_428,0x92e6,GVar8,0x9303);
    (*gl->bindBuffer)(0x90d2,local_658.m_object);
    (*gl->bufferData)(0x90d2,(long)(int)dVar10,(void *)0x0,0x88e1);
    BufferMemMap::BufferMemMap((BufferMemMap *)local_640,gl,0x90d2,0,dVar10,2);
    memset((void *)CONCAT71(local_630._M_allocated_capacity._1_7_,local_630._M_local_buf[0]),0,
           (long)(int)dVar10);
    (**(code **)((long)local_640 + 0x1670))((ulong)local_638 & 0xffffffff);
    (*gl->bindBufferBase)(0x90d2,0,local_658.m_object);
    GVar9 = (*gl->getError)();
    glu::checkError(GVar9,"Output buffer setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x309);
    (*gl->useProgram)(local_3f0.m_program.m_program);
    p_Var5 = gl->uniform1ui;
    GVar11 = (*gl->getUniformLocation)(local_3f0.m_program.m_program,"u_baseVal");
    (*p_Var5)(GVar11,0x7f);
    (*gl->dispatchCompute)
              ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],
               (this->m_workSize).m_data[2]);
    (*gl->memoryBarrier)(0x2000);
    (*gl->useProgram)(local_428);
    (*gl->dispatchCompute)
              ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],
               (this->m_workSize).m_data[2]);
    GVar9 = (*gl->getError)();
    glu::checkError(GVar9,"Failed to dispatch commands",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x313);
    GVar8 = (*gl->getProgramResourceIndex)(local_428,0x92e6,"Output");
    dVar10 = glu::getProgramResourceUint(gl,local_428,0x92e6,GVar8,0x9303);
    GVar8 = (*gl->getProgramResourceIndex)(local_428,0x92e5,"sum");
    local_6c0.name._M_string_length = 0;
    local_6c0.name.field_2._M_local_buf[0] = '\0';
    local_6c0.index = 0xffffffff;
    local_6c0.blockIndex = 0xffffffff;
    local_6c0.atomicCounterBufferIndex = 0xffffffff;
    local_6c0.type = 0;
    local_6c0.arraySize = 0;
    local_6c0.offset = 0;
    local_6c0.arrayStride = 0;
    local_6c0._60_5_ = 0;
    local_6c0._65_8_ = 0;
    local_6c0.name._M_dataplus._M_p = (pointer)paVar2;
    glu::getProgramInterfaceVariableInfo(gl,local_428,0x92e5,GVar8,&local_6c0);
    iVar16 = 0;
    BufferMemMap::BufferMemMap(&local_670,gl,0x90d2,0,dVar10,1);
    iVar7 = (this->m_workSize).m_data[0] * (this->m_workSize).m_data[1] *
            (this->m_workSize).m_data[2];
    if (0 < iVar7) {
      iVar16 = iVar7 * 0x80 + (int)((ulong)(iVar7 - 2) * (ulong)(iVar7 - 1) >> 1) + -1;
    }
    if (*(int *)((long)local_670.m_ptr + (ulong)local_6c0.offset) == iVar16) {
      (*(local_670.m_gl)->unmapBuffer)(local_670.m_target);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_6c0.name._M_dataplus._M_p,
                        CONCAT71(local_6c0.name.field_2._M_allocated_capacity._1_7_,
                                 local_6c0.name.field_2._M_local_buf[0]) + 1);
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      glu::ObjectWrapper::~ObjectWrapper(&local_658);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_6e0);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_4c0);
      glu::ShaderProgram::~ShaderProgram(&local_3f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return STOP;
    }
    local_640 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_638);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_638,"ERROR: comparison failed, expected ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_638);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_638,", got ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_638);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_640,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_638);
    std::ios_base::~ios_base(local_5c8);
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    local_640 = (undefined1  [8])&local_630;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"Comparison failed","");
    tcu::TestError::TestError(pTVar14,(string *)local_640);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x2eb);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion				= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		const char* const	glslVersionDeclaration	= getGLSLVersionDeclaration(glslVersion);

		std::ostringstream src0;
		src0 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "uniform uint u_baseVal;\n"
						  "layout(binding = 1) buffer Output {\n"
						  "    uint values[];\n"
						  "};\n"
						  "void main (void) {\n"
						  "    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
						  "    values[offset] = u_baseVal+offset;\n"
				"}\n";

		std::ostringstream src1;
		src1 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "uniform uint u_baseVal;\n"
						  "layout(binding = 1) buffer Input {\n"
						  "    uint values[];\n"
						  "};\n"
						  "layout(binding = 0) buffer Output {\n"
						  "    coherent uint sum;\n"
						  "};\n"
						  "void main (void) {\n"
						  "    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
						  "    uint value  = values[offset];\n"
						  "    atomicAdd(sum, value);\n"
				"}\n";

		const ShaderProgram			program0		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src0.str()));
		const ShaderProgram			program1		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src1.str()));

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				tempBuffer		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const deUint32				baseValue		= 127;

		m_testCtx.getLog() << program0 << program1;
		if (!program0.isOk() || !program1.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		// Temp buffer setup
		{
			const deUint32				valueIndex		= gl.getProgramResourceIndex(program0.getProgram(), GL_BUFFER_VARIABLE, "values[0]");
			const InterfaceVariableInfo	valueInfo		= getProgramInterfaceVariableInfo(gl, program0.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const deUint32				bufferSize		= valueInfo.arrayStride*m_workSize[0]*m_workSize[1]*m_workSize[2];

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *tempBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)bufferSize, DE_NULL, GL_STATIC_DRAW);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *tempBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Temp buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_WRITE_BIT);
				deMemset(bufMap.getPtr(), 0, blockSize);
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.useProgram(program0.getProgram());
		gl.uniform1ui(gl.getUniformLocation(program0.getProgram(), "u_baseVal"), baseValue);
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		gl.memoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		gl.useProgram(program1.getProgram());
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch commands");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_BUFFER_VARIABLE, "sum");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program1.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			const deUint32				res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset));
			deUint32					ref			= 0;

			for (int ndx = 0; ndx < m_workSize[0]*m_workSize[1]*m_workSize[2]; ndx++)
				ref += baseValue + (deUint32)ndx;

			if (res != ref)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed, expected " << ref << ", got " << res << TestLog::EndMessage;
				throw tcu::TestError("Comparison failed");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}